

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ATTRIBUTE *pAVar10;
  long lVar11;
  char **ppcVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pcVar16;
  byte *pbVar17;
  long lStack_60;
  byte *local_58;
  int local_4c;
  byte *local_48;
  char *local_40;
  char *local_38;
  uint uVar9;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar6 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar17 = (byte *)(ptr + 1);
    uVar7 = (long)end - (long)pbVar17;
    if ((long)uVar7 < 1) {
      return -1;
    }
    lStack_60 = 1;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar17)) {
    case 5:
      if (uVar7 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])
                        (enc,(char *)pbVar17,(char *)&switchD_0038bd16::switchdataD_004d965c,
                         (char **)0x1);
      if (iVar4 != 0) {
        lStack_60 = 2;
        goto switchD_0038bd16_caseD_16;
      }
      break;
    case 6:
      if (uVar7 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,(char *)pbVar17,(char *)&switchD_0038bd16::switchdataD_004d965c,
                         (char **)0x1);
      if (iVar4 != 0) {
        lStack_60 = 3;
        goto switchD_0038bd16_caseD_16;
      }
      break;
    case 7:
      if (uVar7 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)pbVar17,(char *)&switchD_0038bd16::switchdataD_004d965c,
                         (char *)0x1);
      if (iVar4 != 0) {
        lStack_60 = 4;
        goto switchD_0038bd16_caseD_16;
      }
      break;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar14 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar14 || (long)end - (long)pbVar14 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar14);
      if (cVar2 == '\x14') {
        pcVar6 = ptr + 3;
        if ((long)end - (long)pcVar6 < 6) {
          return -1;
        }
        pcVar16 = ptr + 9;
        lVar11 = 0;
        iVar4 = 8;
        do {
          if (lVar11 == 6) {
LAB_0038c591:
            *nextTokPtr = pcVar16;
            return iVar4;
          }
          if (pcVar6[lVar11] != (&big2_scanCdataSection_CDATA_LSQB)[lVar11]) {
            pcVar16 = pcVar6 + lVar11;
            iVar4 = 0;
            goto LAB_0038c591;
          }
          lVar11 = lVar11 + 1;
        } while( true );
      }
      if (cVar2 == '\x1b') {
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      goto LAB_0038c0cd;
    case 0x11:
      pbVar17 = (byte *)(ptr + 2);
      uVar7 = (long)end - (long)pbVar17;
      if ((long)uVar7 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
      ppcVar12 = (char **)(ulong)bVar1;
      iVar4 = 0;
      lStack_60 = 1;
      if (bVar1 != 0x18) {
        if (bVar1 == 6) {
          if (uVar7 < 3) {
            return -2;
          }
          iVar5 = (*enc[3].literalScanners[1])(enc,(char *)pbVar17,(char *)0x1,ppcVar12);
          lStack_60 = 3;
        }
        else if (bVar1 == 7) {
          if (uVar7 < 4) {
            return -2;
          }
          iVar5 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar17,(char *)0x1,(char *)ppcVar12);
          lStack_60 = 4;
        }
        else {
          if (bVar1 == 0x16) goto LAB_0038c125;
          if (bVar1 != 5) goto LAB_0038c666;
          if (uVar7 == 1) {
            return -2;
          }
          iVar5 = (*enc[3].literalScanners[0])(enc,(char *)pbVar17,(char *)0x1,ppcVar12);
          lStack_60 = 2;
        }
        if (iVar5 == 0) goto LAB_0038c666;
      }
LAB_0038c125:
      pbVar17 = pbVar17 + lStack_60;
LAB_0038c12f:
      lStack_60 = 1;
      uVar7 = (long)end - (long)pbVar17;
      if ((long)uVar7 < 1) {
        return -1;
      }
      uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
      uVar8 = uVar9 - 5;
      if (0x16 < uVar8) goto switchD_0038c163_caseD_8;
      pcVar6 = (char *)((long)&switchD_0038c163::switchdataD_004d96ac +
                       (long)(int)(&switchD_0038c163::switchdataD_004d96ac)[uVar8]);
      switch(uVar9) {
      case 5:
        if (uVar7 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
        lStack_60 = 2;
        break;
      case 6:
        if (uVar7 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
        lStack_60 = 3;
        break;
      case 7:
        if (uVar7 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
        lStack_60 = 4;
        break;
      default:
        goto switchD_0038c163_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pcVar6 = end + ~(ulong)pbVar17;
        while( true ) {
          pbVar17 = pbVar17 + 1;
          if ((long)pcVar6 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
          if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
          pcVar6 = pcVar6 + -1;
        }
        if (bVar1 != 0xb) {
switchD_0038c163_caseD_8:
          iVar4 = 0;
          goto LAB_0038c666;
        }
switchD_0038c163_caseD_b:
        pbVar17 = pbVar17 + 1;
        iVar4 = 5;
LAB_0038c666:
        *nextTokPtr = (char *)pbVar17;
        return iVar4;
      case 0xb:
        goto switchD_0038c163_caseD_b;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0038c163_caseD_16;
      }
      if (iVar4 == 0) goto switchD_0038c163_caseD_8;
switchD_0038c163_caseD_16:
      pbVar17 = pbVar17 + lStack_60;
      goto LAB_0038c12f;
    case 0x16:
    case 0x18:
switchD_0038bd16_caseD_16:
      pbVar17 = pbVar17 + lStack_60;
      do {
        lStack_60 = 1;
        uVar7 = (long)end - (long)pbVar17;
        if ((long)uVar7 < 1) {
          return -1;
        }
        uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
        uVar8 = uVar9 - 5;
        if (0x18 < uVar8) break;
        pcVar6 = (char *)((long)&switchD_0038bfb9::switchdataD_004d9708 +
                         (long)(int)(&switchD_0038bfb9::switchdataD_004d9708)[uVar8]);
        switch(uVar9) {
        case 5:
          if (uVar7 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
          lStack_60 = 2;
          break;
        case 6:
          if (uVar7 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
          lStack_60 = 3;
          break;
        case 7:
          if (uVar7 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar17,pcVar6,(char **)0x1);
          lStack_60 = 4;
          break;
        default:
          goto switchD_0038bd16_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pcVar6 = end + ~(ulong)pbVar17;
          goto LAB_0038c037;
        case 0xb:
          goto switchD_0038bfb9_caseD_b;
        case 0x11:
          goto switchD_0038bfb9_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0038bfb9_caseD_16;
        }
        if (iVar4 == 0) break;
switchD_0038bfb9_caseD_16:
        pbVar17 = pbVar17 + lStack_60;
      } while( true );
    }
switchD_0038bd16_caseD_8:
    *nextTokPtr = (char *)pbVar17;
    return 0;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar17 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar17 || (long)end - (long)pbVar17 < 0) {
      return -5;
    }
    if (*pbVar17 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto LAB_0038bd4b;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 == 0) {
      pbVar17 = (byte *)(ptr + 2);
      pcVar6 = extraout_RDX_00;
      goto LAB_0038bd4b;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar6 == 0) {
      pbVar17 = (byte *)(ptr + 3);
      pcVar6 = extraout_RDX;
      goto LAB_0038bd4b;
    }
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)&switchD_0038bb94::switchdataD_004d9630)
    ;
    if (iVar4 == 0) {
      pbVar17 = (byte *)(ptr + 4);
      pcVar6 = extraout_RDX_01;
      goto LAB_0038bd4b;
    }
    break;
  case 9:
    pcVar6 = ptr + 1;
    if (end != pcVar6 && -1 < (long)end - (long)pcVar6) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar6 = ptr + 2;
      }
      *nextTokPtr = pcVar6;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar17 = (byte *)(ptr + 1);
LAB_0038bd4b:
    pbVar14 = pbVar17;
    pAVar10 = (ATTRIBUTE *)(end + -(long)pbVar14);
    if ((long)pAVar10 < 1) goto switchD_0038bd7d_caseD_0;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar14)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      if (pAVar10 == (ATTRIBUTE *)0x1) break;
      pbVar17 = pbVar14 + 1;
      if (pbVar14[1] != 0x5d) goto LAB_0038bd4b;
      if (pAVar10 < (ATTRIBUTE *)0x3) break;
      if (pbVar14[2] == 0x3e) goto LAB_0038bf58;
      goto LAB_0038bd4b;
    case 5:
      if ((pAVar10 != (ATTRIBUTE *)0x1) &&
         (iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar14), iVar4 == 0)) {
        pbVar17 = pbVar14 + 2;
        pcVar6 = extraout_RDX_03;
        goto LAB_0038bd4b;
      }
      break;
    case 6:
      if (((ATTRIBUTE *)0x2 < pAVar10) &&
         (pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar14), (int)pcVar6 == 0)) {
        pbVar17 = pbVar14 + 3;
        pcVar6 = extraout_RDX_02;
        goto LAB_0038bd4b;
      }
      break;
    case 7:
      if (((ATTRIBUTE *)0x3 < pAVar10) &&
         (iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar14,(int)pcVar6,pAVar10), iVar4 == 0)) {
        pbVar17 = pbVar14 + 4;
        pcVar6 = extraout_RDX_04;
        goto LAB_0038bd4b;
      }
      break;
    default:
      pbVar17 = pbVar14 + 1;
      goto LAB_0038bd4b;
    }
switchD_0038bd7d_caseD_0:
    *nextTokPtr = (char *)pbVar14;
    return 6;
  }
switchD_0038bb94_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_0038bf58:
  ptr = (char *)(pbVar14 + 2);
  goto switchD_0038bb94_caseD_0;
LAB_0038c037:
  pbVar17 = pbVar17 + 1;
  if ((long)pcVar6 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
  uVar8 = uVar9 - 5;
  if (0x18 < uVar8) goto switchD_0038bd16_caseD_8;
  pcVar16 = (char *)((long)&switchD_0038c061::switchdataD_004d976c +
                    (long)(int)(&switchD_0038c061::switchdataD_004d976c)[uVar8]);
  switch(uVar9) {
  case 5:
    if (pcVar6 == (char *)0x1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,(char *)pbVar17,pcVar16,(char **)&switchD_0038c061::switchdataD_004d976c)
    ;
    if (iVar4 == 0) goto switchD_0038bd16_caseD_8;
    lStack_60 = 3;
    break;
  case 6:
    if (pcVar6 < (char *)0x3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,(char *)pbVar17,pcVar16,(char **)&switchD_0038c061::switchdataD_004d976c)
    ;
    if (iVar4 == 0) goto switchD_0038bd16_caseD_8;
    lStack_60 = 4;
    break;
  case 7:
    if (pcVar6 < (char *)0x4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,(char *)pbVar17,pcVar16,(char *)&switchD_0038c061::switchdataD_004d976c);
    if (iVar4 == 0) goto switchD_0038bd16_caseD_8;
    lStack_60 = 5;
    break;
  default:
    goto switchD_0038bd16_caseD_8;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0038c061_caseD_9;
  case 0xb:
    goto switchD_0038bfb9_caseD_b;
  case 0x11:
    goto switchD_0038bfb9_caseD_11;
  case 0x16:
  case 0x18:
    lStack_60 = 2;
  }
  local_58 = pbVar17 + lStack_60 + -1;
  local_40 = end + -1;
  local_38 = end + -2;
  goto LAB_0038c1f4;
switchD_0038c061_caseD_9:
  pcVar6 = pcVar6 + -1;
  goto LAB_0038c037;
LAB_0038c1f4:
  pbVar17 = local_58;
  uVar7 = (long)end - (long)local_58;
  if ((long)uVar7 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_58);
  uVar8 = uVar9 - 5;
  if (0x16 < uVar8) {
switchD_0038c224_caseD_8:
    local_4c = 0;
    goto switchD_0038c3af_caseD_0;
  }
  ppcVar12 = (char **)((long)&switchD_0038c224::switchdataD_004d97d0 +
                      (long)(int)(&switchD_0038c224::switchdataD_004d97d0)[uVar8]);
  switch(uVar9) {
  case 5:
    local_4c = 0;
    if (uVar7 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[0])
                      (enc,(char *)local_58,(char *)&switchD_0038c224::switchdataD_004d97d0,ppcVar12
                      );
    if (iVar4 != 0) {
      local_58 = pbVar17 + 2;
      goto LAB_0038c1f4;
    }
    break;
  case 6:
    local_4c = 0;
    if (uVar7 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[1])
                      (enc,(char *)local_58,(char *)&switchD_0038c224::switchdataD_004d97d0,ppcVar12
                      );
    if (iVar4 != 0) {
      local_58 = pbVar17 + 3;
      goto LAB_0038c1f4;
    }
    break;
  case 7:
    local_4c = 0;
    if (uVar7 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[2])
                      (enc,(char *)local_58,(char *)&switchD_0038c224::switchdataD_004d97d0,ppcVar12
                      );
    if (iVar4 != 0) {
      local_58 = pbVar17 + 4;
      goto LAB_0038c1f4;
    }
    break;
  default:
    goto switchD_0038c224_caseD_8;
  case 9:
  case 10:
  case 0x15:
    lVar11 = (long)local_40 - (long)local_58;
    while( true ) {
      pbVar17 = pbVar17 + 1;
      if (lVar11 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      lVar11 = lVar11 + -1;
    }
    local_4c = 0;
    if (bVar1 == 0xe) goto LAB_0038c31f;
    break;
  case 0xe:
LAB_0038c31f:
    local_4c = 0;
    lVar11 = (long)local_40 - (long)pbVar17;
    do {
      pbVar17 = pbVar17 + 1;
      if (lVar11 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar17);
      local_58 = pbVar17;
      if ((bVar1 & 0xfe) == 0xc) {
switchD_0038c3af_caseD_4:
        do {
          local_58 = local_58 + 1;
          while( true ) {
            pbVar17 = local_58;
            uVar7 = (long)end - (long)local_58;
            if ((long)uVar7 < 1) {
              return -1;
            }
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*local_58);
            if (bVar3 == bVar1) {
              pbVar14 = local_58 + 1;
              if ((byte *)end == pbVar14 || (long)end - (long)pbVar14 < 0) {
                return -1;
              }
              bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar14);
              if ((bVar1 - 9 < 2) || (bVar1 == 0x15)) {
                ppcVar12 = (char **)(local_38 + -(long)local_58);
                lVar11 = 0;
                pbVar15 = pbVar14;
                goto LAB_0038c48e;
              }
              if (bVar1 == 0xb) goto LAB_0038c6cf;
              if (bVar1 == 0x11) goto LAB_0038c69b;
              goto LAB_0038c6dd;
            }
            uVar8 = (uint)bVar3;
            if (8 < uVar8) break;
            switch(uVar8) {
            default:
              goto switchD_0038c3af_caseD_0;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)(local_58 + 1),end,(char **)&local_58);
              if (iVar4 < 1) {
                pbVar14 = local_58;
                if (iVar4 != 0) {
                  return iVar4;
                }
                goto LAB_0038c6dd;
              }
              break;
            case 4:
              goto switchD_0038c3af_caseD_4;
            case 5:
              if (uVar7 == 1) {
                return -2;
              }
              iVar4 = (*enc[3].nameLength)(enc,(char *)local_58);
              if (iVar4 != 0) goto switchD_0038c3af_caseD_0;
              local_58 = pbVar17 + 2;
              break;
            case 6:
              if (uVar7 < 3) {
                return -2;
              }
              pcVar6 = (*enc[3].skipS)(enc,(char *)local_58);
              if ((int)pcVar6 != 0) goto switchD_0038c3af_caseD_0;
              local_58 = pbVar17 + 3;
              break;
            case 7:
              if (uVar7 < 4) {
                return -2;
              }
              iVar4 = (*enc[3].getAtts)(enc,(char *)local_58,0x4d982c,
                                        (ATTRIBUTE *)
                                        ((long)&switchD_0038c3af::switchdataD_004d982c +
                                        (long)(int)(&switchD_0038c3af::switchdataD_004d982c)[uVar8])
                                       );
              if (iVar4 != 0) goto switchD_0038c3af_caseD_0;
              local_58 = pbVar17 + 4;
            }
          }
        } while( true );
      }
      if ((0x15 < bVar1) || ((0x200600U >> (bVar1 & 0x1f) & 1) == 0)) break;
      lVar11 = lVar11 + -1;
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0038c224_caseD_16;
  }
switchD_0038c3af_caseD_0:
  pbVar14 = pbVar17;
  goto LAB_0038c6dd;
switchD_0038c224_caseD_16:
  local_58 = local_58 + 1;
  goto LAB_0038c1f4;
LAB_0038c48e:
  if ((long)ppcVar12 < 1) {
    return -1;
  }
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_58[lVar11 + 2]);
  uVar8 = uVar9 - 5;
  if (0x13 < uVar8) {
switchD_0038c4c6_caseD_8:
    pbVar14 = local_58 + lVar11 + 2;
    goto LAB_0038c6dd;
  }
  pbVar15 = pbVar15 + 1;
  pcVar6 = (char *)((long)&switchD_0038c4c6::switchdataD_004d9850 +
                   (long)(int)(&switchD_0038c4c6::switchdataD_004d9850)[uVar8]);
  switch(uVar9) {
  case 5:
    goto switchD_0038c4c6_caseD_5;
  case 6:
    if (ppcVar12 < (char **)0x3) {
      return -2;
    }
    pbVar13 = local_58 + lVar11 + 2;
    local_58 = pbVar14;
    local_48 = pbVar15;
    iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,pcVar6,ppcVar12);
    pbVar14 = local_48;
    if (iVar4 == 0) goto LAB_0038c6dd;
    local_58 = pbVar17 + lVar11 + 5;
    goto LAB_0038c1f4;
  case 7:
    if (ppcVar12 < (char **)0x4) {
      return -2;
    }
    local_48 = local_58 + lVar11 + 2;
    local_58 = pbVar14;
    iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)local_48,pcVar6,(char *)ppcVar12);
    pbVar14 = local_48;
    if (iVar4 == 0) goto LAB_0038c6dd;
    local_58 = pbVar17 + lVar11 + 6;
    goto LAB_0038c1f4;
  default:
    goto switchD_0038c4c6_caseD_8;
  case 9:
  case 10:
  case 0x15:
    break;
  case 0xb:
    local_58 = local_58 + lVar11 + 1;
LAB_0038c6cf:
    pbVar17 = local_58 + 2;
    local_4c = 1;
    goto switchD_0038c3af_caseD_0;
  case 0x11:
    pbVar14 = local_58 + lVar11 + 2;
LAB_0038c69b:
    pbVar17 = pbVar14 + 1;
    if ((byte *)end == pbVar17 || (long)end - (long)pbVar17 < 0) {
      return -1;
    }
    if (pbVar14[1] == 0x3e) {
      pbVar17 = pbVar14 + 2;
    }
    local_4c = (uint)(pbVar14[1] == 0x3e) * 3;
    pbVar14 = pbVar17;
    goto LAB_0038c6dd;
  case 0x16:
  case 0x18:
    local_58 = local_58 + lVar11 + 3;
    goto LAB_0038c1f4;
  }
  lVar11 = lVar11 + 1;
  ppcVar12 = (char **)((long)ppcVar12 + -1);
  goto LAB_0038c48e;
switchD_0038c4c6_caseD_5:
  if (uVar7 - 3 == lVar11) {
    return -2;
  }
  pbVar13 = local_58 + lVar11 + 2;
  local_58 = pbVar14;
  local_48 = pbVar15;
  iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,pcVar6,ppcVar12);
  pbVar14 = local_48;
  if (iVar4 == 0) {
LAB_0038c6dd:
    *nextTokPtr = (char *)pbVar14;
    return local_4c;
  }
  local_58 = pbVar17 + lVar11 + 4;
  goto LAB_0038c1f4;
switchD_0038bfb9_caseD_b:
  *nextTokPtr = (char *)(pbVar17 + 1);
  return 2;
switchD_0038bfb9_caseD_11:
  pbVar14 = pbVar17 + 1;
  if ((byte *)end == pbVar14 || (long)end - (long)pbVar14 < 0) {
    return -1;
  }
  if (*pbVar14 == 0x3e) {
    *nextTokPtr = (char *)(pbVar17 + 2);
    return 4;
  }
LAB_0038c0cd:
  *nextTokPtr = (char *)pbVar14;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}